

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue1f
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,float x)

{
  float location_00 [1];
  bool bVar1;
  qpTestResult qVar2;
  float (*pafVar3) [1];
  TestLog *this;
  MessageBuilder *pMVar4;
  MessageBuilder local_1b0;
  undefined1 local_30 [8];
  StateQueryMemoryWriteGuard<float[1]> state;
  float x_local;
  GLint location_local;
  GLuint program_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  state.m_value[0] = x;
  state.m_postguard[0] = (float)location;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[1]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[1]> *)local_30);
  location_00[0] = state.m_postguard[0];
  pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_30);
  glu::CallLogWrapper::glGetUniformfv(gl,program,(GLint)location_00[0],*pafVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[1]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[1]> *)local_30,testCtx);
  if (bVar1) {
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_30);
    if (((*pafVar3)[0] != state.m_value[0]) || (NAN((*pafVar3)[0]) || NAN(state.m_value[0]))) {
      this = tcu::TestContext::getLog(testCtx);
      tcu::TestLog::operator<<(&local_1b0,this,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [21])"// ERROR: expected [");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_value);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [9])"]; got [");
      pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_30);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29dc08e);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1b0);
      qVar2 = tcu::TestContext::getTestResult(testCtx);
      if (qVar2 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
      }
    }
  }
  return;
}

Assistant:

void verifyUniformValue1f (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, float x)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[1]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x
		<< "]; got ["
		<< state[0]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}